

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

void textui_obj_examine(void)

{
  _Bool _Var1;
  textblock *tb;
  object *obj;
  char header_buf [120];
  
  _Var1 = get_item(&obj,"Examine which item?","You have nothing to examine.",CMD_NULL,
                   (item_tester)0x0,L'\x1f');
  if (_Var1) {
    track_object(player->upkeep,obj);
    tb = object_info(obj,OINFO_NONE);
    object_desc(header_buf,0x78,obj,0xc3,player);
    textui_textblock_show(tb,(region)ZEXT816(0),header_buf);
    textblock_free(tb);
  }
  return;
}

Assistant:

void textui_obj_examine(void)
{
	char header_buf[120];

	textblock *tb;
	region local_area = { 0, 0, 0, 0 };

	struct object *obj;

	/* Select item */
	if (!get_item(&obj, "Examine which item?", "You have nothing to examine.",
			CMD_NULL, NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER | USE_FLOOR | IS_HARMLESS)))
		return;

	/* Track object for object recall */
	track_object(player->upkeep, obj);

	/* Display info */
	tb = object_info(obj, OINFO_NONE);
	object_desc(header_buf, sizeof(header_buf), obj,
		ODESC_PREFIX | ODESC_FULL | ODESC_CAPITAL, player);

	textui_textblock_show(tb, local_area, header_buf);
	textblock_free(tb);
}